

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::json_wrap::from_json(json_wrap *this,string *t_json)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  out_of_range *anon_var_0;
  JSON local_40;
  string *local_18;
  string *t_json_local;
  
  local_18 = t_json;
  t_json_local = (string *)this;
  json::JSON::Load(&local_40,t_json);
  from_json(this,&local_40);
  json::JSON::~JSON(&local_40);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value from_json(const std::string &t_json) {
      try {
        return from_json(json::JSON::Load(t_json));
      } catch (const std::out_of_range &) {
        throw std::runtime_error("Unparsed JSON input");
      }
    }